

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
person::msgpack_pack<msgpack::v1::packer<msgpack::v1::sbuffer>>
          (person *this,packer<msgpack::v1::sbuffer> *msgpack_pk)

{
  int *local_18;
  string *local_10;
  person *local_8;
  
  local_10 = &this->name;
  local_18 = &this->age;
  local_8 = this;
  msgpack::v1::type::define_array<int_const,std::__cxx11::string_const,int_const>::
  msgpack_pack<msgpack::v1::packer<msgpack::v1::sbuffer>>
            ((define_array<int_const,std::__cxx11::string_const,int_const> *)&local_18,msgpack_pk);
  return;
}

Assistant:

void test_get_person_name() {
  try {
    rpc_client client("127.0.0.1", 9000);
    bool r = client.connect();
    if (!r) {
      std::cout << "connect timeout" << std::endl;
      return;
    }

    auto result =
        client.call<std::string>("get_person_name", person{1, "tom", 20});
    std::cout << result << std::endl;
  } catch (const std::exception &e) {
    std::cout << e.what() << std::endl;
  }
}